

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

void setup_r(int *rex,int *r,int v)

{
  int iVar1;
  
  if ((((rex == (int *)0x0) || (*rex < 0)) && ((uint)v < 0x22)) && (*r < 0)) {
    iVar1 = v + -0x10;
    if (v < 0x10) {
      iVar1 = v;
    }
    if (7 < iVar1) {
      if (rex != (int *)0x0) {
        *rex = 1;
      }
      iVar1 = iVar1 + -8;
    }
    *r = iVar1;
    return;
  }
  __assert_fail("(rex == ((void*)0) || *rex < 0) && *r < 0 && v >= 0 && v <= ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x85d,"void setup_r(int *, int *, int)");
}

Assistant:

static void setup_r (int *rex, int *r, int v) {
  gen_assert ((rex == NULL || *rex < 0) && *r < 0 && v >= 0 && v <= MAX_HARD_REG);
  if (v >= 16) v -= 16;
  if (v >= 8) {
    if (rex != NULL) *rex = 1;
    v -= 8;
  }
  *r = v;
}